

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O3

void __thiscall
xs::ProcessFinishedMessage::ProcessFinishedMessage
          (ProcessFinishedMessage *this,deUint8 *data,size_t dataSize)

{
  int iVar1;
  MessageParser parser;
  MessageParser local_28;
  
  (this->super_Message).type = MESSAGETYPE_PROCESS_FINISHED;
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__Message_0010dc68;
  local_28.m_pos = 0;
  local_28.m_data = data;
  local_28.m_size = dataSize;
  iVar1 = MessageParser::get<int>(&local_28);
  *(int *)&(this->super_Message).field_0xc = iVar1;
  MessageParser::assumEnd(&local_28);
  return;
}

Assistant:

ProcessFinishedMessage::ProcessFinishedMessage (const deUint8* data, size_t dataSize)
	: Message(MESSAGETYPE_PROCESS_FINISHED)
{
	MessageParser parser(data, dataSize);
	exitCode = parser.get<int>();
	parser.assumEnd();
}